

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

char * get_netscape_format(Cookie *co)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar1 = co->field_0x74;
  pcVar2 = co->domain;
  if ((bVar1 & 1) == 0) {
    pcVar7 = "FALSE";
  }
  else {
    pcVar7 = "TRUE";
    if (pcVar2 != (char *)0x0) {
      pcVar4 = ".";
      if (*pcVar2 == '.') {
        pcVar4 = "";
      }
      goto LAB_0011f9bb;
    }
    pcVar2 = (char *)0x0;
  }
  pcVar4 = "";
LAB_0011f9bb:
  pcVar3 = "unknown";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  pcVar2 = "/";
  if (co->path != (char *)0x0) {
    pcVar2 = co->path;
  }
  pcVar8 = co->value;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "";
  }
  pcVar5 = "TRUE";
  if ((bVar1 & 2) == 0) {
    pcVar5 = "FALSE";
  }
  pcVar6 = "#HttpOnly_";
  if ((bVar1 & 8) == 0) {
    pcVar6 = "";
  }
  pcVar2 = curl_maprintf("%s%s%s\t%s\t%s\t%s\t%ld\t%s\t%s",pcVar6,pcVar4,pcVar3,pcVar7,pcVar2,pcVar5
                         ,co->expires,co->name,pcVar8);
  return pcVar2;
}

Assistant:

static char *get_netscape_format(const struct Cookie *co)
{
  return aprintf(
    "%s"     /* httponly preamble */
    "%s%s\t" /* domain */
    "%s\t"   /* tailmatch */
    "%s\t"   /* path */
    "%s\t"   /* secure */
    "%" FMT_OFF_T "\t"   /* expires */
    "%s\t"   /* name */
    "%s",    /* value */
    co->httponly ? "#HttpOnly_" : "",
    /*
     * Make sure all domains are prefixed with a dot if they allow
     * tailmatching. This is Mozilla-style.
     */
    (co->tailmatch && co->domain && co->domain[0] != '.') ? "." : "",
    co->domain ? co->domain : "unknown",
    co->tailmatch ? "TRUE" : "FALSE",
    co->path ? co->path : "/",
    co->secure ? "TRUE" : "FALSE",
    co->expires,
    co->name,
    co->value ? co->value : "");
}